

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

bool __thiscall QPDFFormFieldObjectHelper::isText(QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  string local_30;
  
  getFieldType_abi_cxx11_(&local_30,this);
  bVar1 = std::operator==(&local_30,"/Tx");
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool
QPDFFormFieldObjectHelper::isText()
{
    return (getFieldType() == "/Tx");
}